

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O3

Moves * __thiscall Position::GetCaptures(Position *this)

{
  pointer *ppMVar1;
  iterator __position;
  Piece *pPVar2;
  Square SVar3;
  int iVar4;
  undefined4 uVar5;
  pointer pMVar6;
  Move *move;
  pointer __args;
  
  if ((this->m_Captures).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_Captures).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __args = (this->m_Moves).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar6 = (this->m_Moves).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (__args == pMVar6) {
      GenerateMoves(this);
      __args = (this->m_Moves).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
               super__Vector_impl_data._M_start;
      pMVar6 = (this->m_Moves).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    for (; (__args != pMVar6 && (0 < __args->m_Score)); __args = __args + 1) {
      __position._M_current =
           (this->m_Captures).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_Captures).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Move,std::allocator<Move>>::_M_realloc_insert<Move_const&>
                  ((vector<Move,std::allocator<Move>> *)&this->m_Captures,__position,__args);
      }
      else {
        (__position._M_current)->m_PromoteTo = __args->m_PromoteTo;
        pPVar2 = __args->m_Piece;
        SVar3 = __args->m_Source;
        iVar4 = __args->m_Score;
        uVar5 = *(undefined4 *)&__args->field_0x1c;
        (__position._M_current)->m_Dest = __args->m_Dest;
        (__position._M_current)->m_Score = iVar4;
        *(undefined4 *)&(__position._M_current)->field_0x1c = uVar5;
        (__position._M_current)->m_Piece = pPVar2;
        (__position._M_current)->m_Source = SVar3;
        ppMVar1 = &(this->m_Captures).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppMVar1 = *ppMVar1 + 1;
      }
    }
  }
  return &this->m_Captures;
}

Assistant:

const Moves &GetCaptures()
    {
        if ( m_Captures.IsEmpty() )
        {
            if ( m_Moves.IsEmpty() )
                GenerateMoves();

            for ( auto &move : m_Moves )
            {
                if ( move.Score() > 0 )
                    m_Captures.Add( move );
                else
                    break;
            }
        }

        return m_Captures;
    }